

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O1

XmlAttributePtr __thiscall libcellml::XmlNode::firstAttribute(XmlNode *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  XmlNode this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  XmlAttribute *__tmp;
  XmlAttributePtr XVar2;
  xmlAttrPtr attribute;
  undefined1 local_29;
  XmlNode local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  xmlAttrPtr local_18;
  
  local_18 = *(xmlAttrPtr *)(*(long *)*in_RSI + 0x58);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (local_18 != (xmlAttrPtr)0x0) {
    local_28.mPimpl = (XmlNodeImpl *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libcellml::XmlAttribute,std::allocator<libcellml::XmlAttribute>>
              (&_Stack_20,(XmlAttribute **)&local_28,(allocator<libcellml::XmlAttribute> *)&local_29
              );
    _Var1._M_pi = _Stack_20._M_pi;
    this_01.mPimpl = local_28.mPimpl;
    local_28.mPimpl = (XmlNodeImpl *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->mPimpl = (XmlNodeImpl *)this_01;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this[1].mPimpl;
    this[1].mPimpl = (XmlNodeImpl *)_Var1._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
    XmlAttribute::setXmlAttribute((XmlAttribute *)this_01.mPimpl,&local_18);
    in_RDX._M_pi = extraout_RDX;
  }
  XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (XmlAttributePtr)
         XVar2.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlAttributePtr XmlNode::firstAttribute() const
{
    xmlAttrPtr attribute = mPimpl->mXmlNodePtr->properties;
    XmlAttributePtr attributeHandle = nullptr;
    if (attribute != nullptr) {
        attributeHandle = std::make_shared<XmlAttribute>();
        attributeHandle->setXmlAttribute(attribute);
    }
    return attributeHandle;
}